

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkPermute(Abc_Ntk_t *pNtk,int fInputs,int fOutputs,int fFlops,char *pFlopPermFile)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  int *__ptr;
  ulong uVar13;
  void *pvVar14;
  uint *__ptr_00;
  void *__s;
  uint *__ptr_01;
  void *__s_00;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  uVar10 = pNtk->nObjCounts[8];
  if (pFlopPermFile == (char *)0x0) {
    pVVar11 = (Vec_Int_t *)malloc(0x10);
    uVar6 = 0x10;
    if (0xe < uVar10 - 1) {
      uVar6 = uVar10;
    }
    pVVar11->nCap = uVar6;
    if (uVar6 == 0) {
      piVar12 = (int *)0x0;
    }
    else {
      piVar12 = (int *)malloc((long)(int)uVar6 << 2);
    }
    pVVar11->pArray = piVar12;
    pVVar11->nSize = uVar10;
    auVar5 = _DAT_007ee2e0;
    if (0 < (int)uVar10) {
      lVar17 = (ulong)uVar10 - 1;
      auVar25._8_4_ = (int)lVar17;
      auVar25._0_8_ = lVar17;
      auVar25._12_4_ = (int)((ulong)lVar17 >> 0x20);
      uVar19 = 0;
      auVar25 = auVar25 ^ _DAT_007ee2e0;
      auVar30 = _DAT_007ee2d0;
      do {
        auVar29 = auVar30 ^ auVar5;
        if ((bool)(~(auVar29._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar29._0_4_ ||
                    auVar25._4_4_ < auVar29._4_4_) & 1)) {
          piVar12[uVar19] = (int)uVar19;
        }
        if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
            auVar29._12_4_ <= auVar25._12_4_) {
          piVar12[uVar19 + 1] = (int)uVar19 + 1;
        }
        uVar19 = uVar19 + 2;
        lVar17 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar17 + 2;
      } while ((uVar10 + 1 & 0xfffffffe) != uVar19);
    }
    bVar22 = fInputs == 0;
    bVar23 = fOutputs == 0;
    bVar24 = fFlops != 0;
  }
  else {
    pVVar11 = Abc_NtkReadFlopPerm(pFlopPermFile,uVar10);
    if (pVVar11 == (Vec_Int_t *)0x0) {
      return;
    }
    bVar23 = true;
    bVar24 = false;
    bVar22 = true;
  }
  pVVar2 = pNtk->vPis;
  uVar10 = pVVar2->nSize;
  uVar19 = (ulong)uVar10;
  uVar6 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar6 = uVar10;
  }
  if (uVar6 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)(int)uVar6 << 2);
  }
  auVar5 = _DAT_007ee2e0;
  if (0 < (int)uVar10) {
    lVar17 = uVar19 - 1;
    auVar26._8_4_ = (int)lVar17;
    auVar26._0_8_ = lVar17;
    auVar26._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar16 = 0;
    auVar26 = auVar26 ^ _DAT_007ee2e0;
    auVar29 = _DAT_007ee2d0;
    do {
      auVar30 = auVar29 ^ auVar5;
      if ((bool)(~(auVar30._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar30._0_4_ ||
                  auVar26._4_4_ < auVar30._4_4_) & 1)) {
        piVar12[uVar16] = (int)uVar16;
      }
      if ((auVar30._12_4_ != auVar26._12_4_ || auVar30._8_4_ <= auVar26._8_4_) &&
          auVar30._12_4_ <= auVar26._12_4_) {
        piVar12[uVar16 + 1] = (int)uVar16 + 1;
      }
      uVar16 = uVar16 + 2;
      lVar17 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 2;
      auVar29._8_8_ = lVar17 + 2;
    } while ((uVar10 + 1 & 0xfffffffe) != uVar16);
  }
  uVar6 = pNtk->vPos->nSize;
  uVar16 = (ulong)uVar6;
  uVar9 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar9 = uVar6;
  }
  if (uVar9 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar9 << 2);
  }
  auVar5 = _DAT_007ee2e0;
  if (0 < (int)uVar6) {
    lVar17 = uVar16 - 1;
    auVar27._8_4_ = (int)lVar17;
    auVar27._0_8_ = lVar17;
    auVar27._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar27 = auVar27 ^ _DAT_007ee2e0;
    auVar28 = _DAT_007ee2d0;
    do {
      auVar30 = auVar28 ^ auVar5;
      if ((bool)(~(auVar30._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar30._0_4_ ||
                  auVar27._4_4_ < auVar30._4_4_) & 1)) {
        __ptr[uVar18] = (int)uVar18;
      }
      if ((auVar30._12_4_ != auVar27._12_4_ || auVar30._8_4_ <= auVar27._8_4_) &&
          auVar30._12_4_ <= auVar27._12_4_) {
        __ptr[uVar18 + 1] = (int)uVar18 + 1;
      }
      uVar18 = uVar18 + 2;
      lVar17 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar17 + 2;
    } while ((uVar6 + 1 & 0xfffffffe) != uVar18);
  }
  if ((!bVar22) && (0 < pVVar2->nSize)) {
    uVar18 = 0;
    uVar21 = 0;
    if (0 < (int)uVar10) {
      uVar21 = (ulong)uVar10;
    }
    do {
      iVar7 = rand();
      pVVar2 = pNtk->vPis;
      uVar13 = (long)iVar7 % (long)pVVar2->nSize;
      if (((uVar21 == uVar18) || (uVar9 = (uint)uVar13, (int)uVar9 < 0)) || (uVar10 <= uVar9))
      goto LAB_001e873f;
      iVar7 = piVar12[uVar18];
      uVar13 = uVar13 & 0xffffffff;
      piVar12[uVar18] = piVar12[uVar13];
      piVar12[uVar13] = iVar7;
      if (((long)pVVar2->nSize <= (long)uVar18) || ((uint)pVVar2->nSize <= uVar9))
      goto LAB_001e8701;
      ppvVar3 = pVVar2->pArray;
      pvVar14 = ppvVar3[uVar18];
      ppvVar3[uVar18] = ppvVar3[uVar13];
      if (pNtk->vPis->nSize <= (int)uVar9) goto LAB_001e8720;
      pNtk->vPis->pArray[uVar13] = pvVar14;
      uVar8 = pNtk->vCis->nSize;
      if (((long)(int)uVar8 <= (long)uVar18) || (uVar8 <= uVar9)) goto LAB_001e8701;
      ppvVar3 = pNtk->vCis->pArray;
      pvVar14 = ppvVar3[uVar18];
      ppvVar3[uVar18] = ppvVar3[uVar13];
      if (pNtk->vCis->nSize <= (int)uVar9) goto LAB_001e8720;
      pNtk->vCis->pArray[uVar13] = pvVar14;
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)pNtk->vPis->nSize);
  }
  if ((!bVar23) && (0 < pNtk->vPos->nSize)) {
    uVar21 = 0;
    uVar18 = 0;
    if (0 < (int)uVar6) {
      uVar18 = uVar16;
    }
    do {
      iVar7 = rand();
      pVVar2 = pNtk->vPos;
      uVar13 = (long)iVar7 % (long)pVVar2->nSize;
      if (((uVar18 == uVar21) || (uVar9 = (uint)uVar13, (int)uVar9 < 0)) || (uVar6 <= uVar9))
      goto LAB_001e873f;
      iVar7 = __ptr[uVar21];
      uVar13 = uVar13 & 0xffffffff;
      __ptr[uVar21] = __ptr[uVar13];
      __ptr[uVar13] = iVar7;
      if (((long)pVVar2->nSize <= (long)uVar21) || ((uint)pVVar2->nSize <= uVar9))
      goto LAB_001e8701;
      ppvVar3 = pVVar2->pArray;
      pvVar14 = ppvVar3[uVar21];
      ppvVar3[uVar21] = ppvVar3[uVar13];
      if (pNtk->vPos->nSize <= (int)uVar9) goto LAB_001e8720;
      pNtk->vPos->pArray[uVar13] = pvVar14;
      uVar8 = pNtk->vCos->nSize;
      if (((long)(int)uVar8 <= (long)uVar21) || (uVar8 <= uVar9)) goto LAB_001e8701;
      ppvVar3 = pNtk->vCos->pArray;
      pvVar14 = ppvVar3[uVar21];
      ppvVar3[uVar21] = ppvVar3[uVar13];
      if (pNtk->vCos->nSize <= (int)uVar9) goto LAB_001e8720;
      pNtk->vCos->pArray[uVar13] = pvVar14;
      uVar21 = uVar21 + 1;
    } while ((long)uVar21 < (long)pNtk->vPos->nSize);
  }
  iVar7 = pNtk->vBoxes->nSize;
  if (iVar7 != pNtk->nObjCounts[8]) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x7e3,"void Abc_NtkPermute(Abc_Ntk_t *, int, int, int, char *)");
  }
  if (bVar24 && 0 < iVar7) {
    lVar17 = 0;
    do {
      iVar7 = rand();
      uVar18 = (long)iVar7 % (long)pNtk->nObjCounts[8];
      if (((pVVar11->nSize <= lVar17) || (uVar9 = (uint)uVar18, (int)uVar9 < 0)) ||
         ((uint)pVVar11->nSize <= uVar9)) {
LAB_001e873f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = pVVar11->pArray;
      iVar7 = piVar4[lVar17];
      uVar18 = uVar18 & 0xffffffff;
      piVar4[lVar17] = piVar4[uVar18];
      piVar4[uVar18] = iVar7;
      uVar8 = pNtk->vBoxes->nSize;
      if (((int)uVar8 <= lVar17) || (uVar8 <= uVar9)) {
LAB_001e8701:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar3 = pNtk->vBoxes->pArray;
      pvVar14 = ppvVar3[lVar17];
      ppvVar3[lVar17] = ppvVar3[uVar18];
      if (pNtk->vBoxes->nSize <= (int)uVar9) {
LAB_001e8720:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pNtk->vBoxes->pArray[uVar18] = pvVar14;
      uVar8 = pNtk->vPis->nSize;
      uVar18 = (ulong)uVar8 + lVar17;
      iVar7 = (int)uVar18;
      if (iVar7 < 0) goto LAB_001e8701;
      uVar1 = pNtk->vCis->nSize;
      if ((((int)uVar1 <= iVar7) || (uVar8 = uVar8 + uVar9, (int)uVar8 < 0)) || (uVar1 <= uVar8))
      goto LAB_001e8701;
      ppvVar3 = pNtk->vCis->pArray;
      uVar18 = uVar18 & 0xffffffff;
      pvVar14 = ppvVar3[uVar18];
      ppvVar3[uVar18] = ppvVar3[uVar8];
      uVar8 = pNtk->vPis->nSize + uVar9;
      if (((int)uVar8 < 0) || (pNtk->vCis->nSize <= (int)uVar8)) goto LAB_001e8720;
      pNtk->vCis->pArray[uVar8] = pvVar14;
      uVar8 = pNtk->vPos->nSize;
      uVar18 = (ulong)uVar8 + lVar17;
      iVar7 = (int)uVar18;
      if (iVar7 < 0) goto LAB_001e8701;
      uVar1 = pNtk->vCos->nSize;
      if ((((int)uVar1 <= iVar7) || (uVar8 = uVar8 + uVar9, (int)uVar8 < 0)) || (uVar1 <= uVar8))
      goto LAB_001e8701;
      ppvVar3 = pNtk->vCos->pArray;
      uVar18 = uVar18 & 0xffffffff;
      pvVar14 = ppvVar3[uVar18];
      ppvVar3[uVar18] = ppvVar3[uVar8];
      uVar9 = pNtk->vPos->nSize + uVar9;
      if (((int)uVar9 < 0) || (pNtk->vCos->nSize <= (int)uVar9)) goto LAB_001e8720;
      pNtk->vCos->pArray[uVar9] = pvVar14;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pNtk->nObjCounts[8]);
  }
  if (uVar19 == 0) {
    pvVar14 = (void *)0x0;
    uVar9 = 0;
    uVar10 = 0;
    if (piVar12 != (int *)0x0) goto LAB_001e8393;
  }
  else {
    iVar7 = *piVar12;
    if (1 < (int)uVar10) {
      uVar18 = 1;
      do {
        if (iVar7 <= piVar12[uVar18]) {
          iVar7 = piVar12[uVar18];
        }
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar18);
    }
    uVar9 = iVar7 + 1;
    if (iVar7 < 0) {
      pvVar14 = (void *)0x0;
    }
    else {
      pvVar14 = malloc((ulong)uVar9 << 2);
      if (pvVar14 == (void *)0x0) goto LAB_001e877d;
      memset(pvVar14,0xff,(ulong)uVar9 << 2);
    }
    if (0 < (int)uVar10) {
      uVar18 = 0;
      do {
        uVar10 = piVar12[uVar18];
        if ((ulong)uVar10 != 0xffffffff) {
          if (((int)uVar10 < 0) || (iVar7 < (int)uVar10)) goto LAB_001e875e;
          *(int *)((long)pvVar14 + (ulong)uVar10 * 4) = (int)uVar18;
        }
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar18);
    }
LAB_001e8393:
    free(piVar12);
    uVar10 = uVar9;
  }
  __ptr_00 = (uint *)calloc(1,0x10);
  if (uVar16 == 0) {
    __s = (void *)0x0;
    uVar9 = 0;
    uVar6 = 0;
    if (__ptr != (int *)0x0) goto LAB_001e8483;
  }
  else {
    iVar7 = *__ptr;
    if (1 < (int)uVar6) {
      uVar19 = 1;
      do {
        if (iVar7 <= __ptr[uVar19]) {
          iVar7 = __ptr[uVar19];
        }
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    uVar9 = iVar7 + 1;
    if (iVar7 < 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc((ulong)uVar9 << 2);
      *(void **)(__ptr_00 + 2) = __s;
      if (__s == (void *)0x0) goto LAB_001e877d;
      *__ptr_00 = uVar9;
      memset(__s,0xff,(ulong)uVar9 << 2);
    }
    __ptr_00[1] = uVar9;
    if (0 < (int)uVar6) {
      uVar19 = 0;
      do {
        uVar6 = __ptr[uVar19];
        if ((ulong)uVar6 != 0xffffffff) {
          if (((int)uVar6 < 0) || (iVar7 < (int)uVar6)) goto LAB_001e875e;
          *(int *)((long)__s + (ulong)uVar6 * 4) = (int)uVar19;
        }
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
LAB_001e8483:
    free(__ptr);
    uVar6 = uVar9;
  }
  __ptr_01 = (uint *)calloc(1,0x10);
  uVar9 = pVVar11->nSize;
  uVar19 = (ulong)uVar9;
  piVar12 = pVVar11->pArray;
  if (uVar19 == 0) {
    uVar8 = 0;
    __s_00 = (void *)0x0;
    if (piVar12 != (int *)0x0) goto LAB_001e857d;
  }
  else {
    iVar7 = *piVar12;
    if (1 < (int)uVar9) {
      uVar16 = 1;
      do {
        if (iVar7 <= piVar12[uVar16]) {
          iVar7 = piVar12[uVar16];
        }
        uVar16 = uVar16 + 1;
      } while (uVar19 != uVar16);
    }
    uVar8 = iVar7 + 1;
    if (iVar7 < 0) {
      __s_00 = (void *)0x0;
    }
    else {
      __s_00 = malloc((ulong)uVar8 << 2);
      *(void **)(__ptr_01 + 2) = __s_00;
      if (__s_00 == (void *)0x0) {
LAB_001e877d:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *__ptr_01 = uVar8;
      memset(__s_00,0xff,(ulong)uVar8 << 2);
    }
    __ptr_01[1] = uVar8;
    if (0 < (int)uVar9) {
      uVar16 = 0;
      do {
        uVar9 = piVar12[uVar16];
        if ((ulong)uVar9 != 0xffffffff) {
          if (((int)uVar9 < 0) || (iVar7 < (int)uVar9)) {
LAB_001e875e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)__s_00 + (ulong)uVar9 * 4) = (int)uVar16;
        }
        uVar16 = uVar16 + 1;
      } while (uVar19 != uVar16);
    }
LAB_001e857d:
    free(piVar12);
  }
  free(pVVar11);
  pVVar11 = pNtk->vObjPerm;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vObjPerm->pArray = (int *)0x0;
      pVVar11 = pNtk->vObjPerm;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_001e85cc;
    }
    free(pVVar11);
  }
LAB_001e85cc:
  iVar20 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  iVar7 = pNtk->nObjCounts[8];
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < (iVar7 + iVar20) - 1U) {
    iVar15 = iVar20 + iVar7;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar15;
  if (iVar15 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar15 << 2);
  }
  pVVar11->pArray = piVar12;
  pNtk->vObjPerm = pVVar11;
  if (0 < (int)uVar10) {
    uVar19 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,*(int *)((long)pvVar14 + uVar19 * 4));
      uVar19 = uVar19 + 1;
    } while (uVar10 != uVar19);
  }
  if (0 < (int)uVar6) {
    uVar19 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,*(int *)((long)__s + uVar19 * 4));
      uVar19 = uVar19 + 1;
    } while (uVar6 != uVar19);
  }
  if (0 < (int)uVar8) {
    uVar19 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,*(int *)((long)__s_00 + uVar19 * 4));
      uVar19 = uVar19 + 1;
    } while (uVar8 != uVar19);
  }
  if (pvVar14 != (void *)0x0) {
    free(pvVar14);
    __s = *(void **)(__ptr_00 + 2);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(__ptr_00);
  if (*(void **)(__ptr_01 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_01 + 2));
  }
  free(__ptr_01);
  return;
}

Assistant:

void Abc_NtkPermute( Abc_Ntk_t * pNtk, int fInputs, int fOutputs, int fFlops, char * pFlopPermFile )
{
    Abc_Obj_t * pTemp;
    Vec_Int_t * vInputs, * vOutputs, * vFlops, * vTemp;
    int i, k, Entry;
    // start permutation arrays
    if ( pFlopPermFile )
    {
        vFlops = Abc_NtkReadFlopPerm( pFlopPermFile, Abc_NtkLatchNum(pNtk) );
        if ( vFlops == NULL )
            return;
        fInputs  = 0;
        fOutputs = 0;
        fFlops   = 0;
    }
    else
        vFlops   = Vec_IntStartNatural( Abc_NtkLatchNum(pNtk) );
    vInputs  = Vec_IntStartNatural( Abc_NtkPiNum(pNtk) );
    vOutputs = Vec_IntStartNatural( Abc_NtkPoNum(pNtk) );
    // permute inputs
    if ( fInputs )
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPiNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vInputs, i );
        Vec_IntWriteEntry( vInputs, i, Vec_IntEntry(vInputs, k) );
        Vec_IntWriteEntry( vInputs, k, Entry );
        // swap PIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPis, i );
        Vec_PtrWriteEntry( pNtk->vPis, i, Vec_PtrEntry(pNtk->vPis, k) );
        Vec_PtrWriteEntry( pNtk->vPis, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, i );
        Vec_PtrWriteEntry( pNtk->vCis, i, Vec_PtrEntry(pNtk->vCis, k) );
        Vec_PtrWriteEntry( pNtk->vCis, k, pTemp );
//printf( "Swapping PIs %d and %d.\n", i, k );
    }
    // permute outputs
    if ( fOutputs )
    for ( i = 0; i < Abc_NtkPoNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPoNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vOutputs, i );
        Vec_IntWriteEntry( vOutputs, i, Vec_IntEntry(vOutputs, k) );
        Vec_IntWriteEntry( vOutputs, k, Entry );
        // swap POs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPos, i );
        Vec_PtrWriteEntry( pNtk->vPos, i, Vec_PtrEntry(pNtk->vPos, k) );
        Vec_PtrWriteEntry( pNtk->vPos, k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, i );
        Vec_PtrWriteEntry( pNtk->vCos, i, Vec_PtrEntry(pNtk->vCos, k) );
        Vec_PtrWriteEntry( pNtk->vCos, k, pTemp );
//printf( "Swapping POs %d and %d.\n", i, k );
    }
    // permute flops
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    if ( fFlops )
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkLatchNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vFlops, i );
        Vec_IntWriteEntry( vFlops, i, Vec_IntEntry(vFlops, k) );
        Vec_IntWriteEntry( vFlops, k, Entry );
        // swap flops
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vBoxes, i );
        Vec_PtrWriteEntry( pNtk->vBoxes, i, Vec_PtrEntry(pNtk->vBoxes, k) );
        Vec_PtrWriteEntry( pNtk->vBoxes, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i, Vec_PtrEntry(pNtk->vCis, Abc_NtkPiNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i, Vec_PtrEntry(pNtk->vCos, Abc_NtkPoNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+k, pTemp );

//printf( "Swapping flops %d and %d.\n", i, k );
    }
    // invert arrays
    vInputs = Vec_IntInvert( vTemp = vInputs, -1 );
    Vec_IntFree( vTemp );
    vOutputs = Vec_IntInvert( vTemp = vOutputs, -1 );
    Vec_IntFree( vTemp );
    vFlops = Vec_IntInvert( vTemp = vFlops, -1 );
    Vec_IntFree( vTemp );
    // pack the results into the output array
    Vec_IntFreeP( &pNtk->vObjPerm );
    pNtk->vObjPerm = Vec_IntAlloc( Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) );
    Vec_IntForEachEntry( vInputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vOutputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vFlops );
}